

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool __thiscall
ON_RTree::Search(ON_RTree *this,double *a_min,double *a_max,ON_SimpleArray<ON_RTreeLeaf> *a_result)

{
  ON_RTreeNode *a_node;
  ON_RTreeBBox rect;
  ON_RTreeBBox local_38;
  
  a_node = this->m_root;
  if (a_node != (ON_RTreeNode *)0x0) {
    local_38.m_min[2] = a_min[2];
    local_38.m_min[0] = *a_min;
    local_38.m_min[1] = a_min[1];
    local_38.m_max[0] = *a_max;
    local_38.m_max[1] = a_max[1];
    local_38.m_max[2] = a_max[2];
    SearchHelper(a_node,&local_38,a_result);
  }
  return a_node != (ON_RTreeNode *)0x0;
}

Assistant:

bool ON_RTree::Search(const double a_min[ON_RTree_NODE_DIM], const double a_max[ON_RTree_NODE_DIM],
                          ON_SimpleArray<ON_RTreeLeaf>& a_result 
                          ) const
{
  if ( 0 == m_root )
    return false;

  ON_RTreeBBox rect;
  memcpy(rect.m_min,a_min,sizeof(rect.m_min));
  memcpy(rect.m_max,a_max,sizeof(rect.m_max));

  return SearchHelper(m_root, &rect, a_result);
}